

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QSize __thiscall QRenderRule::boxSize(QRenderRule *this,QSize *cs,int flags)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.x1.m_i = 0;
  local_28.y1.m_i = 0;
  iVar1 = (cs->wd).m_i;
  local_28.x2.m_i = iVar1 + -1;
  iVar2 = (cs->ht).m_i;
  local_28.y2.m_i = iVar2 + -1;
  QVar5 = boxRect(this,&local_28,flags);
  uVar3 = 0xffffffff00000000;
  if (-1 < iVar2) {
    uVar3 = (ulong)((QVar5.y2.m_i.m_i - QVar5.y1.m_i) + 1) << 0x20;
  }
  uVar4 = 0xffffffff;
  if (-1 < iVar1) {
    uVar4 = (ulong)((QVar5.x2.m_i.m_i - QVar5.x1.m_i) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSize)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

QSize QRenderRule::boxSize(const QSize &cs, int flags) const
{
    QSize bs = boxRect(QRect(QPoint(0, 0), cs), flags).size();
    if (cs.width() < 0) bs.setWidth(-1);
    if (cs.height() < 0) bs.setHeight(-1);
    return bs;
}